

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

void __thiscall
wabt::Module::AppendField
          (Module *this,
          unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_> *field)

{
  ExportModuleField *pEVar1;
  Export *local_68;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  _Head_base<0UL,_wabt::ExportModuleField_*,_false> local_38;
  
  pEVar1 = (field->_M_t).
           super___uniq_ptr_impl<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>
           .super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl;
  local_68 = (Export *)
             (pEVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField.loc.
             filename.data_;
  uStack_60 = (undefined4)
              (pEVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField.loc.
              filename.size_;
  uStack_5c = *(undefined4 *)
               ((long)&(pEVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField.
                       loc.filename.size_ + 4);
  local_58 = (pEVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField.loc.
             field_1.field_0.line;
  iStack_54 = (pEVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField.loc.
              field_1.field_0.first_column;
  iStack_50 = (pEVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField.loc.
              field_1.field_0.last_column;
  uStack_4c = *(undefined4 *)
               ((long)&(pEVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField.
                       loc.field_1 + 0xc);
  local_48 = (undefined4)
             ((ulong)((long)(this->exports).
                            super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->exports).
                           super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 3);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
  ::_M_emplace<std::__cxx11::string&,wabt::Binding>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
              *)&this->export_bindings,&pEVar1->export_,&local_68);
  local_68 = &pEVar1->export_;
  std::vector<wabt::Export*,std::allocator<wabt::Export*>>::emplace_back<wabt::Export*>
            ((vector<wabt::Export*,std::allocator<wabt::Export*>> *)&this->exports,&local_68);
  local_38._M_head_impl =
       (field->_M_t).
       super___uniq_ptr_impl<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>
       ._M_t.
       super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>
       .super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl;
  (field->_M_t).
  super___uniq_ptr_impl<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>._M_t
  .super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>.
  super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl = (ExportModuleField *)0x0;
  intrusive_list<wabt::ModuleField>::push_back
            (&this->fields,
             (unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_> *)&local_38);
  if (local_38._M_head_impl != (ExportModuleField *)0x0) {
    (*((local_38._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField.
      _vptr_ModuleField[1])();
  }
  return;
}

Assistant:

void Module::AppendField(std::unique_ptr<ExportModuleField> field) {
  // Exported names are allowed to be empty.
  Export& export_ = field->export_;
  export_bindings.emplace(export_.name, Binding(field->loc, exports.size()));
  exports.push_back(&export_);
  fields.push_back(std::move(field));
}